

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void dfg_ready_handler(CManager cm,CMConnection conn,void *vmsg,void *client_data,attr_list attrs)

{
  void *__ptr;
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  uint *puVar5;
  timespec ts;
  
  *(undefined4 *)((long)client_data + 0x30) = *vmsg;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x40b);
  __ptr = *(void **)((long)client_data + 0x48);
  *(undefined8 *)((long)client_data + 0x48) = 0;
  iVar2 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"ENABLING AUTO STONES, list is %p\n",__ptr);
  }
  fflush((FILE *)cm->CMTrace_file);
  if (__ptr != (void *)0x0) {
    for (puVar5 = (uint *)((long)__ptr + 8); puVar5[-1] != 0xffffffff; puVar5 = puVar5 + 3) {
      iVar2 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"auto stone %d, period %d sec, %d usec\n",(ulong)puVar5[-2]
                ,(ulong)puVar5[-1],(ulong)*puVar5);
      }
      fflush((FILE *)cm->CMTrace_file);
      INT_EVenable_auto_stone(cm,puVar5[-2],puVar5[-1],*puVar5);
    }
    free(__ptr);
  }
  if (*(int *)((long)client_data + 0x1c) == -1) {
    iVar2 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Client DFG %p Node id %d got ready, reconfig done\n",
              client_data,(ulong)*(uint *)((long)client_data + 0x30));
    }
    fflush((FILE *)cm->CMTrace_file);
  }
  else {
    iVar2 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Client DFG %p Node id %d is ready, signalling %d\n",
              client_data,(ulong)*(uint *)((long)client_data + 0x30),
              (ulong)*(uint *)((long)client_data + 0x1c));
    }
    fflush((FILE *)cm->CMTrace_file);
    INT_CMCondition_signal(cm,*(int *)((long)client_data + 0x1c));
  }
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x413);
  return;
}

Assistant:

static void
dfg_ready_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = client_data;
    EVready_ptr msg =  vmsg;
    (void) conn;
    (void) attrs;
    client->my_node_id = msg->node_id;
    CManager_lock(cm);
    enable_auto_stones(cm, client);
    if (client->ready_condition != -1) {
	CMtrace_out(cm, EVdfgVerbose, "Client DFG %p Node id %d is ready, signalling %d\n", client, client->my_node_id, client->ready_condition);
	INT_CMCondition_signal(cm, client->ready_condition);
    } else {
	CMtrace_out(cm, EVdfgVerbose, "Client DFG %p Node id %d got ready, reconfig done\n", client, client->my_node_id);
    }	
    CManager_unlock(cm);
}